

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

bool cvui::internal::inputUpdateFocus(int theX,int theY,String *theName,Rect *theRect)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          gInput,theName);
  iVar2 = iarea(theX,theY,theRect->width,theRect->height);
  iVar3 = iarea(0,0,10000000,10000000);
  if (iVar2 == 3 && !_Var1) {
    std::__cxx11::string::_M_assign((string *)gInput);
    _Var1 = true;
  }
  else if (((iVar2 != 3) && (iVar3 == 3)) && (_Var1)) {
    std::__cxx11::string::assign(gInput);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool inputUpdateFocus(int theX, int theY, const cv::String& theName, cv::Rect &theRect) {
		bool aFocused = gInput.name == theName;

        int aInputAreaInteraction = cvui::iarea(theX, theY, theRect.width, theRect.height);
		int aOutsideAreaInteraction = cvui::iarea(0, 0, 10000000, 10000000);
        bool aIsGainFocusInteraction = aInputAreaInteraction == cvui::CLICK;
        bool aIsLoseFocusInteraction = aOutsideAreaInteraction == cvui::CLICK;

		if (!aFocused && aIsGainFocusInteraction) {
            gInput.name = theName;
			aFocused = true;
		} else if (aFocused && aIsLoseFocusInteraction && !aIsGainFocusInteraction) {
            gInput.name = "";
			aFocused = false;
		}

        return aFocused;
    }